

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O1

void __thiscall
bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::
Section6InvalidSelfIssuedpathLenConstraintTest16<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
::~Section6InvalidSelfIssuedpathLenConstraintTest16
          (Section6InvalidSelfIssuedpathLenConstraintTest16<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest06VerifyingBasicConstraints,
                     Section6InvalidSelfIssuedpathLenConstraintTest16) {
  const char* const certs[] = {
      "TrustAnchorRootCertificate", "pathLenConstraint0CACert",
      "pathLenConstraint0SelfIssuedCACert", "pathLenConstraint0subCA2Cert",
      "InvalidSelfIssuedpathLenConstraintTest16EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "pathLenConstraint0CACRL",
                              "pathLenConstraint0subCA2CRL"};
  PkitsTestInfo info;
  info.test_number = "4.6.16";
  info.should_validate = false;

  this->RunTest(certs, crls, info);
}